

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chnsecal.cpp
# Opt level: O3

int32_t __thiscall icu_63::ChineseCalendar::newYear(ChineseCalendar *this,int32_t gyear)

{
  uint value;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  UErrorCode status;
  UErrorCode local_2c;
  
  local_2c = U_ZERO_ERROR;
  value = CalendarCache::get(&gChineseCalendarNewYearCache,gyear,&local_2c);
  if (value != 0) goto LAB_001eb6f6;
  iVar1 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x32])(this,(ulong)(gyear - 1));
  iVar2 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x32])(this,gyear);
  uVar3 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x33])((double)(iVar1 + 1),this,1);
  value = (*(this->super_Calendar).super_UObject._vptr_UObject[0x33])
                    ((double)(int)(uVar3 + 0x19),this,1);
  uVar4 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x33])((double)(iVar2 + 1),this,0);
  iVar1 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x34])
                    (this,(ulong)uVar3,(ulong)uVar4);
  if (iVar1 == 0xc) {
    iVar1 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x36])(this,(ulong)uVar3);
    if ((char)iVar1 == '\0') {
      iVar1 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x36])(this,(ulong)value);
      if ((char)iVar1 == '\0') goto LAB_001eb6e1;
    }
    value = (*(this->super_Calendar).super_UObject._vptr_UObject[0x33])
                      ((double)(int)(value + 0x19),this,1);
  }
LAB_001eb6e1:
  CalendarCache::put(&gChineseCalendarNewYearCache,gyear,value,&local_2c);
LAB_001eb6f6:
  uVar3 = 0;
  if (local_2c < U_ILLEGAL_ARGUMENT_ERROR) {
    uVar3 = value;
  }
  return uVar3;
}

Assistant:

int32_t ChineseCalendar::newYear(int32_t gyear) const {
    UErrorCode status = U_ZERO_ERROR;
    int32_t cacheValue = CalendarCache::get(&gChineseCalendarNewYearCache, gyear, status);

    if (cacheValue == 0) {

        int32_t solsticeBefore= winterSolstice(gyear - 1);
        int32_t solsticeAfter = winterSolstice(gyear);
        int32_t newMoon1 = newMoonNear(solsticeBefore + 1, TRUE);
        int32_t newMoon2 = newMoonNear(newMoon1 + SYNODIC_GAP, TRUE);
        int32_t newMoon11 = newMoonNear(solsticeAfter + 1, FALSE);
        
        if (synodicMonthsBetween(newMoon1, newMoon11) == 12 &&
            (hasNoMajorSolarTerm(newMoon1) || hasNoMajorSolarTerm(newMoon2))) {
            cacheValue = newMoonNear(newMoon2 + SYNODIC_GAP, TRUE);
        } else {
            cacheValue = newMoon2;
        }

        CalendarCache::put(&gChineseCalendarNewYearCache, gyear, cacheValue, status);
    }
    if(U_FAILURE(status)) {
        cacheValue = 0;
    }
    return cacheValue;
}